

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O0

void __thiscall gdsSTR::reset(gdsSTR *this)

{
  allocator<char> local_31;
  string local_30 [8];
  string name;
  gdsSTR *this_local;
  
  name.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"",&local_31);
  std::allocator<char>::~allocator(&local_31);
  this->heirarchical_level = 0;
  this->bounding_box[0] = 0;
  this->bounding_box[1] = 0;
  std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>::clear(&this->BOUNDARY);
  std::vector<gdsPATH,_std::allocator<gdsPATH>_>::clear(&this->PATH);
  std::vector<gdsSREF,_std::allocator<gdsSREF>_>::clear(&this->SREF);
  std::vector<gdsAREF,_std::allocator<gdsAREF>_>::clear(&this->AREF);
  std::vector<gdsTEXT,_std::allocator<gdsTEXT>_>::clear(&this->TEXT);
  std::vector<gdsNODE,_std::allocator<gdsNODE>_>::clear(&this->NODE);
  std::vector<gdsBOX,_std::allocator<gdsBOX>_>::clear(&this->BOX);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void gdsSTR::reset()
{
  string name = "\0";
  heirarchical_level = 0;
  bounding_box[0] = {0};
  bounding_box[1] = {0};
  BOUNDARY.clear();
  PATH.clear();
  SREF.clear();
  AREF.clear();
  TEXT.clear();
  NODE.clear();
  BOX.clear();
}